

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdManOperation(If_DsdMan_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  long lVar1;
  void **ppvVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  word *pwVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar26;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uchar pPermNew [12];
  char pCanonPerm [12];
  int pBegEnd [12];
  int pChildren [12];
  uchar *local_f0;
  ulong local_e8;
  undefined1 local_bc [12];
  ulong local_b0;
  uint local_a8;
  char local_a4 [12];
  uint local_98 [12];
  uint local_68 [14];
  
  if (Type - 3U < 2) {
    if (nLits < 1) {
      uVar5 = 0;
      If_DsdObjSort(p,&p->vObjs,(int *)local_68,0,(int *)local_98);
      iVar7 = 0;
    }
    else {
      local_b0 = (ulong)(uint)nLits;
      uVar16 = 0;
      local_e8 = 0;
      uVar5 = 0;
      uVar12 = 0;
      puVar14 = pPerm;
      do {
        uVar17 = pLits[uVar16];
        if (Type == 4) {
          if ((int)uVar17 < 0) goto LAB_004254ee;
          if ((uVar17 & 1) != 0) {
            uVar17 = uVar17 & 0x7ffffffe;
            pLits[uVar16] = uVar17;
            uVar5 = uVar5 ^ 1;
          }
        }
        else if ((int)uVar17 < 0) goto LAB_004254cf;
        uVar6 = (p->vObjs).nSize;
        if ((int)uVar6 <= (int)(uVar17 >> 1)) goto LAB_004254b0;
        ppvVar2 = (p->vObjs).pArray;
        pvVar3 = ppvVar2[uVar17 >> 1];
        uVar9 = *(uint *)((long)pvVar3 + 4);
        if (((uVar9 & 7) == Type) && ((Type == 4 || ((uVar17 & 1) == 0)))) {
          if (0x7ffffff < uVar9) {
            lVar8 = (long)(int)local_e8;
            local_e8 = 0;
            uVar17 = uVar12;
            do {
              uVar15 = *(uint *)((long)pvVar3 + local_e8 * 4 + 8);
              uVar12 = uVar17;
              if (uVar15 == 0) break;
              if (Type == 3) {
                local_68[lVar8 + local_e8] = uVar15;
                if ((int)uVar15 < 0) goto LAB_004254cf;
              }
              else {
                if ((int)uVar15 < 0) goto LAB_004254ee;
                if ((uVar15 & 1) != 0) {
                  __assert_fail("Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                                ,0x60c,
                                "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                               );
                }
                local_68[lVar8 + local_e8] = uVar15;
              }
              if (uVar6 <= uVar15 >> 1) goto LAB_004254b0;
              uVar12 = (*(uint *)((long)ppvVar2[uVar15 >> 1] + 4) >> 3 & 0x1f) + uVar17;
              local_98[lVar8 + local_e8] = uVar17 << 0x10 | uVar12;
              local_e8 = local_e8 + 1;
              uVar17 = uVar12;
            } while (local_e8 < uVar9 >> 0x1b);
            local_e8 = lVar8 + local_e8;
          }
        }
        else {
          uVar6 = If_DsdManPushInv(p,uVar17,puVar14);
          lVar8 = (long)(int)local_e8;
          local_68[lVar8] = uVar6 ^ uVar17;
          uVar9 = *(uint *)((long)pvVar3 + 4);
          uVar17 = (uVar9 >> 3 & 0x1f) + uVar12;
          local_e8 = (ulong)((int)local_e8 + 1);
          local_98[lVar8] = uVar12 << 0x10 | uVar17;
          uVar12 = uVar17;
        }
        puVar14 = puVar14 + (uVar9 >> 3 & 0x1f);
        uVar16 = uVar16 + 1;
      } while (uVar16 != local_b0);
      iVar7 = (int)local_e8;
      If_DsdObjSort(p,&p->vObjs,(int *)local_68,iVar7,(int *)local_98);
      if (iVar7 < 1) {
        uVar17 = 0;
      }
      else {
        uVar16 = 0;
        uVar17 = 0;
        do {
          uVar9 = local_98[uVar16] & 0xff;
          uVar6 = (int)local_98[uVar16] >> 0x10;
          if ((int)uVar6 < (int)uVar9) {
            memcpy(local_bc + (int)uVar17,pPerm + (int)uVar6,(ulong)(~uVar6 + uVar9) + 1);
            auVar24._8_4_ = 0xffffffff;
            auVar24._0_8_ = 0xffffffffffffffff;
            auVar24._12_4_ = 0xffffffff;
            lVar10 = (ulong)uVar9 - (long)(int)uVar6;
            lVar8 = lVar10 + -1;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = (long)(int)uVar17;
            auVar21._8_4_ = (int)lVar8;
            auVar21._0_8_ = lVar8;
            auVar21._12_4_ = (int)((ulong)lVar8 >> 0x20);
            lVar8 = 2;
            do {
              auVar20 = auVar19;
              auVar19._0_8_ = auVar20._0_8_ + 1;
              auVar19._8_8_ = auVar20._8_8_ - auVar24._8_8_;
              lVar1 = (lVar10 + 1U & 0xfffffffffffffffe) + lVar8;
              lVar8 = lVar8 + -2;
            } while (lVar1 != 4);
            lVar8 = -lVar8;
            auVar23._8_4_ = (int)lVar8;
            auVar23._0_8_ = lVar8;
            auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
            auVar21 = auVar21 ^ _DAT_0093d220;
            auVar24 = (auVar23 | _DAT_0093d210) ^ _DAT_0093d220;
            iVar28 = -(uint)(auVar21._0_4_ < auVar24._0_4_);
            iVar29 = -(uint)(auVar21._4_4_ < auVar24._4_4_);
            iVar30 = -(uint)(auVar21._8_4_ < auVar24._8_4_);
            iVar31 = -(uint)(auVar21._12_4_ < auVar24._12_4_);
            iVar26 = -(uint)(auVar24._4_4_ == auVar21._4_4_);
            iVar27 = -(uint)(auVar24._12_4_ == auVar21._12_4_);
            auVar22._4_4_ = iVar26;
            auVar22._0_4_ = iVar26;
            auVar22._8_4_ = iVar27;
            auVar22._12_4_ = iVar27;
            auVar4._4_4_ = iVar28;
            auVar4._0_4_ = iVar28;
            auVar4._8_4_ = iVar30;
            auVar4._12_4_ = iVar30;
            auVar25._4_4_ = iVar29;
            auVar25._0_4_ = iVar29;
            auVar25._8_4_ = iVar31;
            auVar25._12_4_ = iVar31;
            auVar25 = auVar25 | auVar22 & auVar4;
            auVar19 = ~auVar25 & auVar19 | auVar20 & auVar25;
            uVar17 = auVar19._8_4_ + auVar19._0_4_;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (local_e8 & 0xffffffff));
      }
      if (uVar17 != uVar12) {
        __assert_fail("j == nSSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x61f,
                      "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                     );
      }
      if (0 < (int)uVar12) {
        memcpy(pPerm,local_bc,(ulong)uVar12);
      }
    }
    goto LAB_00425478;
  }
  if (Type == 6) {
    uVar12 = Abc_TtCanonicize(pTruth,nLits,local_a4);
    local_a8 = If_DsdManComputeFirstArray(p,pLits,nLits,(int *)local_98);
    if (nLits < 1) {
      uVar5 = 0;
      iVar7 = 0;
    }
    else {
      local_b0 = (ulong)(uint)nLits;
      uVar16 = 0;
      uVar5 = 0;
      do {
        uVar17 = pLits[local_a4[uVar16]];
        if ((int)uVar17 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if ((p->vObjs).nSize <= (int)(uVar17 >> 1)) goto LAB_004254b0;
        uVar9 = (uVar12 >> ((uint)uVar16 & 0x1f) & 1) != 0 ^ uVar17;
        pvVar3 = (p->vObjs).pArray[uVar17 >> 1];
        uVar17 = local_98[local_a4[uVar16]];
        uVar6 = If_DsdManPushInv(p,uVar9,pPerm + (int)uVar17);
        local_68[uVar16] = uVar6 ^ uVar9;
        uVar6 = *(uint *)((long)pvVar3 + 4) >> 3;
        uVar9 = uVar6 & 0x1f;
        if (uVar9 != 0) {
          memcpy(local_bc + (int)uVar5,pPerm + (int)uVar17,(ulong)(uVar6 & 0x1f));
          uVar5 = uVar5 + uVar9;
        }
        uVar16 = uVar16 + 1;
        iVar7 = nLits;
      } while (local_b0 != uVar16);
    }
    if (uVar5 != local_a8) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x65c,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    if (0 < (int)local_a8) {
      memcpy(pPerm,local_bc,(ulong)local_a8);
    }
    iVar26 = p->nVars;
    if (iVar26 != nLits) {
      if (iVar26 <= nLits) {
        __assert_fail("nVarS < nVarB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x47d,"void Abc_TtStretch6(word *, int, int)");
      }
      uVar5 = 1 << ((char)nLits - 6U & 0x1f);
      if (nLits < 7) {
        uVar5 = 1;
      }
      uVar17 = 1 << ((char)iVar26 - 6U & 0x1f);
      if (iVar26 < 7) {
        uVar17 = 1;
      }
      if (uVar5 != uVar17) {
        if ((int)uVar17 <= (int)uVar5) {
          __assert_fail("step < nWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x482,"void Abc_TtStretch6(word *, int, int)");
        }
        if (0 < (int)uVar17) {
          lVar8 = 0;
          pwVar11 = pTruth;
          do {
            if (0 < (int)uVar5) {
              uVar16 = 0;
              do {
                pwVar11[uVar16] = pTruth[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar5 != uVar16);
            }
            lVar8 = lVar8 + (int)uVar5;
            pwVar11 = pwVar11 + (int)uVar5;
          } while (lVar8 < (long)(ulong)uVar17);
        }
      }
    }
    uVar5 = (uint)((uVar12 >> (nLits & 0x1fU) & 1) != 0);
    goto LAB_00425478;
  }
  if (Type != 5) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x661,
                  "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)")
    ;
  }
  if (nLits != 3) {
    __assert_fail("nLits == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x626,
                  "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)")
    ;
  }
  lVar8 = 0;
  puVar14 = pPerm;
  do {
    uVar12 = pLits[lVar8];
    if ((int)uVar12 < 0) goto LAB_004254cf;
    if ((p->vObjs).nSize <= (int)(uVar12 >> 1)) goto LAB_004254b0;
    pvVar3 = (p->vObjs).pArray[uVar12 >> 1];
    uVar5 = If_DsdManPushInv(p,uVar12,puVar14);
    pLits[lVar8] = uVar5 ^ uVar12;
    puVar14 = puVar14 + (*(uint *)((long)pvVar3 + 4) >> 3 & 0x1f);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  iVar7 = If_DsdObjCompare(p,&p->vObjs,pLits[1],pLits[2]);
  if (iVar7 == 1) {
    uVar12 = *pLits;
    if ((int)uVar12 < 0) goto LAB_004254cf;
LAB_004252b7:
    uVar5 = (p->vObjs).nSize;
    if ((int)uVar5 <= (int)(uVar12 >> 1)) {
LAB_004254b0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar17 = pLits[1];
    if ((int)uVar17 < 0) {
LAB_004254cf:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (uVar5 <= uVar17 >> 1) goto LAB_004254b0;
    uVar6 = pLits[2];
    if ((int)uVar6 < 0) goto LAB_004254cf;
    if (uVar5 <= uVar6 >> 1) goto LAB_004254b0;
    ppvVar2 = (p->vObjs).pArray;
    uVar5 = *(uint *)((long)ppvVar2[uVar12 >> 1] + 4) >> 3;
    uVar9 = uVar5 & 0x1f;
    uVar13 = *(uint *)((long)ppvVar2[uVar17 >> 1] + 4) >> 3;
    uVar18 = *(uint *)((long)ppvVar2[uVar6 >> 1] + 4) >> 3;
    uVar15 = uVar18 & 0x1f;
    *pLits = uVar12 ^ 1;
    pLits[1] = uVar6;
    pLits[2] = uVar17;
    if (uVar9 != 0) {
      memcpy(local_bc,pPerm,(ulong)(uVar5 & 0x1f));
    }
    uVar12 = uVar13 & 0x1f;
    if (uVar15 != 0) {
      memcpy(local_bc + uVar9,pPerm + (uVar9 + uVar12),(ulong)(uVar18 & 0x1f));
    }
    if (uVar12 != 0) {
      memcpy(local_bc + (uVar9 + uVar15),pPerm + uVar9,(ulong)(uVar13 & 0x1f));
    }
    uVar15 = uVar12 + uVar9 + uVar15;
    if (uVar15 != 0) {
      memcpy(pPerm,local_bc,(ulong)uVar15);
    }
  }
  else if (iVar7 == 0) {
    uVar12 = *pLits;
    if ((int)uVar12 < 0) goto LAB_004254ee;
    if ((uVar12 & 1) != 0) goto LAB_004252b7;
  }
  uVar12 = pLits[1];
  if ((int)uVar12 < 0) {
LAB_004254ee:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  uVar5 = 0;
  if ((uVar12 & 1) != 0) {
    pLits[1] = uVar12 & 0x7ffffffe;
    if (pLits[2] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    pLits[2] = pLits[2] ^ 1;
    uVar5 = 1;
  }
  lVar8 = 0;
  local_f0 = pPerm;
  do {
    uVar12 = pLits[lVar8];
    if ((int)uVar12 < 0) goto LAB_004254cf;
    if ((p->vObjs).nSize <= (int)(uVar12 >> 1)) goto LAB_004254b0;
    pvVar3 = (p->vObjs).pArray[uVar12 >> 1];
    uVar17 = If_DsdManPushInv(p,uVar12,local_f0);
    local_68[lVar8] = uVar17 ^ uVar12;
    lVar8 = lVar8 + 1;
    local_f0 = local_f0 + (*(uint *)((long)pvVar3 + 4) >> 3 & 0x1f);
  } while (lVar8 != 3);
  iVar7 = 3;
LAB_00425478:
  iVar7 = If_DsdObjFindOrAdd(p,Type,(int *)local_68,iVar7,pTruth);
  if (iVar7 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  return uVar5 + iVar7 * 2;
}

Assistant:

int If_DsdManOperation( If_DsdMan_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    If_DsdObj_t * pObj, * pFanin;
    unsigned char pPermNew[DAU_MAX_VAR], * pPermStart = pPerm;
    int nChildren = 0, pChildren[DAU_MAX_VAR], pBegEnd[DAU_MAX_VAR];
    int i, k, j, Id, iFanin, fCompl = 0, nSSize = 0;
    if ( Type == IF_DSD_AND || Type == IF_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            if ( Type == IF_DSD_XOR && Abc_LitIsCompl(pLits[k]) )
            {
                pLits[k] = Abc_LitNot(pLits[k]);
                fCompl ^= 1;
            }
            pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            if ( Type == If_DsdObjType(pObj) && (Type == IF_DSD_XOR || !Abc_LitIsCompl(pLits[k])) )
            {
                If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
                {
                    assert( Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin) );
                    pChildren[nChildren] = iFanin;
                    pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdVecLitSuppSize(&p->vObjs, iFanin));
                    nSSize += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
                }
            }
            else
            {
                pChildren[nChildren] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
                pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdObjSuppSize(pObj));
                nSSize += If_DsdObjSuppSize(pObj);
            }
            pPermStart += If_DsdObjSuppSize(pObj);
        }
        If_DsdObjSort( p, &p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPermNew[j++] = pPerm[k];
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
    }
    else if ( Type == IF_DSD_MUX )
    {
        int RetValue;
        assert( nLits == 3 );
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pLits[k] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
        RetValue = If_DsdObjCompare( p, &p->vObjs, pLits[1], pLits[2] );
        if ( RetValue == 1 || (RetValue == 0 && Abc_LitIsCompl(pLits[0])) )
        {
            int nSupp0 = If_DsdVecLitSuppSize( &p->vObjs, pLits[0] );
            int nSupp1 = If_DsdVecLitSuppSize( &p->vObjs, pLits[1] );
            int nSupp2 = If_DsdVecLitSuppSize( &p->vObjs, pLits[2] );
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
            for ( j = k = 0; k < nSupp0; k++ )
                pPermNew[j++] = pPerm[k];
            for ( k = 0; k < nSupp2; k++ )
                pPermNew[j++] = pPerm[nSupp0 + nSupp1 + k];
            for ( k = 0; k < nSupp1; k++ )
                pPermNew[j++] = pPerm[nSupp0 + k];
            for ( j = 0; j < nSupp0 + nSupp1 + nSupp2; j++ )
                pPerm[j] = pPermNew[j];
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        pPermStart = pPerm;
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pChildren[nChildren++] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
    }
    else if ( Type == IF_DSD_PRIME )
    {
        char pCanonPerm[DAU_MAX_VAR];
        int i, uCanonPhase, pFirsts[DAU_MAX_VAR];
        uCanonPhase = Abc_TtCanonicize( pTruth, nLits, pCanonPerm );
        fCompl = ((uCanonPhase >> nLits) & 1);
        nSSize = If_DsdManComputeFirstArray( p, pLits, nLits, pFirsts );
        for ( j = i = 0; i < nLits; i++ )
        {
            int iLitNew = Abc_LitNotCond( pLits[(int)pCanonPerm[i]], ((uCanonPhase>>i)&1) );
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLitNew) );
            pPermStart = pPerm + pFirsts[(int)pCanonPerm[i]];
            pChildren[nChildren++] = Abc_LitNotCond( iLitNew, If_DsdManPushInv(p, iLitNew, pPermStart) );
            for ( k = 0; k < (int)pFanin->nSupp; k++ )            
                pPermNew[j++] = pPermStart[k];
        }
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
        Abc_TtStretch6( pTruth, nLits, p->nVars );
    }
    else assert( 0 );
    // create new graph
    Id = If_DsdObjFindOrAdd( p, Type, pChildren, nChildren, pTruth );
    return Abc_Var2Lit( Id, fCompl );
}